

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void lzham::lzham_print_mem_stats(lzham_malloc_context context)

{
  long in_RDI;
  uint in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  
  if (in_RDI == 0) {
    lzham_assert(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return;
}

Assistant:

void lzham_print_mem_stats(lzham_malloc_context context)
   {
      LZHAM_VERIFY(context);

#if LZHAM_MEM_STATS
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      printf("Current blocks: %u, allocated: %" LZHAM_PRIu64 ", max ever allocated: %" LZHAM_PRIi64 "\n", pContext->m_total_blocks, (int64)pContext->m_cur_allocated, (int64)pContext->m_max_allocated);
      printf("Max used arena: %u\n", pContext->m_arena_ofs);
      printf("Max blocks: %" LZHAM_PRIu64 "\n", pContext->m_max_blocks);
#endif
   }